

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditions.cc
# Opt level: O2

bool __thiscall
absl::lts_20240722::log_internal::LogEveryNSecState::ShouldLog
          (LogEveryNSecState *this,double seconds)

{
  int64_t iVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  double dVar5;
  
  (this->counter_).super___atomic_base<unsigned_int>._M_i =
       (this->counter_).super___atomic_base<unsigned_int>._M_i + 1;
  iVar1 = base_internal::CycleClock::Now();
  lVar2 = (this->next_log_time_cycles_).super___atomic_base<long>._M_i;
  do {
    lVar3 = lVar2;
    if (iVar1 <= lVar3) break;
    dVar5 = base_internal::CycleClock::Frequency();
    LOCK();
    lVar2 = (this->next_log_time_cycles_).super___atomic_base<long>._M_i;
    bVar4 = lVar3 == lVar2;
    if (bVar4) {
      (this->next_log_time_cycles_).super___atomic_base<long>._M_i =
           (long)(dVar5 * seconds + (double)iVar1);
      lVar2 = lVar3;
    }
    UNLOCK();
  } while (!bVar4);
  return lVar3 < iVar1;
}

Assistant:

bool LogEveryNSecState::ShouldLog(double seconds) {
  using absl::base_internal::CycleClock;
  LossyIncrement(&counter_);
  const int64_t now_cycles = CycleClock::Now();
  int64_t next_cycles = next_log_time_cycles_.load(std::memory_order_relaxed);
#if defined(__myriad2__)
  // myriad2 does not have 8-byte compare and exchange.  Use a racy version that
  // is "good enough" but will over-log in the face of concurrent logging.
  if (now_cycles > next_cycles) {
    next_log_time_cycles_.store(now_cycles + seconds * CycleClock::Frequency(),
                                std::memory_order_relaxed);
    return true;
  }
  return false;
#else
  do {
    if (now_cycles <= next_cycles) return false;
  } while (!next_log_time_cycles_.compare_exchange_weak(
      next_cycles, now_cycles + seconds * CycleClock::Frequency(),
      std::memory_order_relaxed, std::memory_order_relaxed));
  return true;
#endif
}